

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tictactoe.cpp
# Opt level: O0

void __thiscall Game::PrintBoard(Game *this)

{
  char cVar1;
  const_reference pvVar2;
  reference pvVar3;
  ostream *poVar4;
  int local_20;
  undefined1 local_19;
  int i;
  array<char,_9UL> symbols;
  Game *this_local;
  
  symbols._M_elems._1_8_ = this;
  memset(&local_19,0,9);
  for (local_20 = 0; local_20 < 9; local_20 = local_20 + 1) {
    pvVar2 = std::array<Player,_9UL>::operator[](&this->m_board,(long)local_20);
    cVar1 = GetPlayerSymbol(*pvVar2);
    pvVar3 = std::array<char,_9UL>::operator[]((array<char,_9UL> *)&local_19,(long)local_20);
    *pvVar3 = cVar1;
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"     |     |     ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(poVar4,"  ");
  pvVar3 = std::array<char,_9UL>::operator[]((array<char,_9UL> *)&local_19,0);
  poVar4 = std::operator<<(poVar4,*pvVar3);
  poVar4 = std::operator<<(poVar4,"  |  ");
  pvVar3 = std::array<char,_9UL>::operator[]((array<char,_9UL> *)&local_19,1);
  poVar4 = std::operator<<(poVar4,*pvVar3);
  poVar4 = std::operator<<(poVar4,"  |  ");
  pvVar3 = std::array<char,_9UL>::operator[]((array<char,_9UL> *)&local_19,2);
  poVar4 = std::operator<<(poVar4,*pvVar3);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(poVar4,"_____|_____|_____");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(poVar4,"     |     |     ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(poVar4,"  ");
  pvVar3 = std::array<char,_9UL>::operator[]((array<char,_9UL> *)&local_19,3);
  poVar4 = std::operator<<(poVar4,*pvVar3);
  poVar4 = std::operator<<(poVar4,"  |  ");
  pvVar3 = std::array<char,_9UL>::operator[]((array<char,_9UL> *)&local_19,4);
  poVar4 = std::operator<<(poVar4,*pvVar3);
  poVar4 = std::operator<<(poVar4,"  |  ");
  pvVar3 = std::array<char,_9UL>::operator[]((array<char,_9UL> *)&local_19,5);
  poVar4 = std::operator<<(poVar4,*pvVar3);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(poVar4,"_____|_____|_____");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(poVar4,"     |     |     ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(poVar4,"  ");
  pvVar3 = std::array<char,_9UL>::operator[]((array<char,_9UL> *)&local_19,6);
  poVar4 = std::operator<<(poVar4,*pvVar3);
  poVar4 = std::operator<<(poVar4,"  |  ");
  pvVar3 = std::array<char,_9UL>::operator[]((array<char,_9UL> *)&local_19,7);
  poVar4 = std::operator<<(poVar4,*pvVar3);
  poVar4 = std::operator<<(poVar4,"  |  ");
  pvVar3 = std::array<char,_9UL>::operator[]((array<char,_9UL> *)&local_19,8);
  poVar4 = std::operator<<(poVar4,*pvVar3);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(poVar4,"     |     |     ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void PrintBoard() const noexcept {
            std::array<char, 9> symbols {};
            for (auto i = 0; i < 9; ++i) {
                symbols[i] = GetPlayerSymbol(m_board[i]);
            }

            std::cout 
                << "     |     |     " << std::endl
                << "  " << symbols[0] << "  |  " << symbols[1] << "  |  " << symbols[2] << std::endl
                << "_____|_____|_____" << std::endl
                << "     |     |     " << std::endl
                << "  " << symbols[3] << "  |  " << symbols[4] << "  |  " << symbols[5] << std::endl
                << "_____|_____|_____" << std::endl
                << "     |     |     " << std::endl
                << "  " << symbols[6] << "  |  " << symbols[7] << "  |  " << symbols[8] << std::endl
                << "     |     |     " << std::endl 
                << std::endl;
        }